

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address-conversion.cc
# Opt level: O3

uint64_t str2num(string *str)

{
  pointer pcVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  char **__endptr;
  char *local_50 [2];
  char local_40 [16];
  
  piVar2 = __errno_location();
  pcVar6 = (str->_M_dataplus)._M_p;
  iVar5 = *piVar2;
  *piVar2 = 0;
  __endptr = local_50;
  lVar3 = strtol(pcVar6,__endptr,0x10);
  if (local_50[0] != pcVar6) {
    __endptr = (char **)0x0;
    do {
      if (((int)lVar3 != lVar3) || (*piVar2 == 0x22)) {
        uVar4 = std::__throw_out_of_range("stoi");
        if (*piVar2 == 0) {
          *piVar2 = iVar5;
        }
        _Unwind_Resume(uVar4);
      }
      if (*piVar2 == 0) {
        *piVar2 = iVar5;
      }
      pcVar6 = local_50[0] + (1 - (long)pcVar6);
      if (pcVar6 == (char *)str->_M_string_length) {
        return (long)__endptr + lVar3;
      }
      pcVar1 = (str->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)local_50,pcVar6 + (long)pcVar1,
                 (char *)str->_M_string_length + (long)pcVar1);
      std::__cxx11::string::operator=((string *)str,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      __endptr = (char **)(((long)__endptr + lVar3) * 0x100);
      pcVar6 = (str->_M_dataplus)._M_p;
      iVar5 = *piVar2;
      *piVar2 = 0;
      lVar3 = strtol(pcVar6,local_50,0x10);
    } while (local_50[0] != pcVar6);
  }
  std::__throw_invalid_argument("stoi");
  return (uint64_t)__endptr;
}

Assistant:

uint64_t str2num(std::string str)
{
    size_t   pos    = 0;
    uint64_t result = 0;

    while (1)
    {
        result = result * 0x100 + std::stoi(str, &pos, 16);
        if (++pos == str.size())
        {
            break;
        }
        str = std::string(str.begin() + pos, str.end());
    }
    return result;
}